

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::
emplace_back<slang::ast::ValueSymbol_const&>
          (SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *this,ValueSymbol *args)

{
  ValueSymbol *in_RSI;
  SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *in_RDI;
  ValueSymbol *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *in_stack_00000030;
  SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *this_00;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::ValueSymbol_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    this_00 = in_RDI;
    end(in_RDI);
    analysis::DataFlowAnalysis::LValueSymbol::LValueSymbol((LValueSymbol *)this_00,in_RSI);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }